

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void kratos::add_debug_info(FSMState *state,shared_ptr<kratos::FunctionCallStmt> *func_stmt)

{
  undefined8 *puVar1;
  undefined1 local_58 [8];
  unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  fn_ln;
  __alloc_node_gen_t __alloc_node_gen;
  
  fn_ln._M_h._M_single_bucket = (__node_base_ptr)local_58;
  local_58 = (undefined1  [8])0x0;
  fn_ln._M_h._M_buckets = (__buckets_ptr)(state->output_fn_ln_)._M_h._M_bucket_count;
  fn_ln._M_h._M_bucket_count = 0;
  fn_ln._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)(state->output_fn_ln_)._M_h._M_element_count;
  fn_ln._M_h._M_element_count = *(size_type *)&(state->output_fn_ln_)._M_h._M_rehash_policy;
  fn_ln._M_h._M_rehash_policy._0_8_ = (state->output_fn_ln_)._M_h._M_rehash_policy._M_next_resize;
  fn_ln._M_h._M_rehash_policy._M_next_resize = 0;
  std::
  _Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,false>>>>
            ((_Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)fn_ln._M_h._M_single_bucket,&(state->output_fn_ln_)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>_>_>
              *)&fn_ln._M_h._M_single_bucket);
  for (puVar1 = (undefined8 *)fn_ln._M_h._M_bucket_count; puVar1 != (undefined8 *)0x0;
      puVar1 = (undefined8 *)*puVar1) {
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>const&>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(((func_stmt->
                     super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_Stmt).super_IRNode.fn_name_ln,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)(puVar1 + 2));
  }
  std::
  _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_58);
  return;
}

Assistant:

void add_debug_info(const FSMState* state, const std::shared_ptr<FunctionCallStmt>& func_stmt) {
    auto fn_ln = state->output_fn_ln();
    for (auto const& iter : fn_ln) {
        func_stmt->fn_name_ln.emplace_back(iter.second);
    }
}